

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::EncodeDecodeTest_DecodeDeterministicOutput_Test::
TestBody(EncodeDecodeTest_DecodeDeterministicOutput_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  string *filename;
  char *in_R9;
  pointer *__ptr;
  string_view expected_text;
  string golden_path;
  AssertHelper local_c0;
  string local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_88;
  AlphaNum *local_80;
  long local_78 [2];
  undefined1 local_68 [32];
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  
  TestTempDir_abi_cxx11_();
  filename = &local_b8;
  local_b8._M_dataplus._M_p = (pointer)local_80;
  local_b8._M_string_length = (size_type)local_88._M_head_impl;
  local_48 = (undefined1  [8])&DAT_0000000f;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10e9b6e;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_68,(lts_20250127 *)filename,(AlphaNum *)local_48,local_80);
  if (local_88._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78) {
    filename = (string *)(local_78[0] + 1);
    operator_delete(local_88._M_head_impl,(ulong)filename);
  }
  WriteGoldenMessage((string *)local_68);
  EncodeDecodeTest::RedirectStdinFromFile((EncodeDecodeTest *)local_68._0_8_,filename);
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "google/protobuf/unittest.proto --decode=proto2_unittest.TestAllTypes --deterministic_output"
             ,"");
  bVar2 = EncodeDecodeTest::Run(&this->super_EncodeDecodeTest,&local_b8,true);
  local_48[0] = !bVar2;
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar1) {
    if (!bVar2) goto LAB_00a1caa4;
  }
  else {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    if (((ulong)local_48 & 1) != 0) goto LAB_00a1caa4;
  }
  testing::Message::Message((Message *)&local_88);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_b8,(internal *)local_48,
             (AssertionResult *)
             "Run(\"google/protobuf/unittest.proto\" \" --decode=proto2_unittest.TestAllTypes --deterministic_output\")"
             ,"true","false",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
             ,0x1219,local_b8._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_88._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_88._M_head_impl + 8))();
  }
LAB_00a1caa4:
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  expected_text._M_str = "Can only use --deterministic_output with --encode.";
  expected_text._M_len = 0x32;
  EncodeDecodeTest::ExpectError(&this->super_EncodeDecodeTest,expected_text);
  if ((EncodeDecodeTest *)local_68._0_8_ != (EncodeDecodeTest *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, DecodeDeterministicOutput) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(golden_path);
  EXPECT_FALSE(
      Run("google/protobuf/unittest.proto"
          " --decode=proto2_unittest.TestAllTypes --deterministic_output"));
  ExpectError("Can only use --deterministic_output with --encode.");
}